

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

BlendFunc vkt::pipeline::mapVkBlendFactor(VkBlendFactor blend)

{
  BlendFunc local_c;
  VkBlendFactor blend_local;
  
  switch(blend) {
  case VK_BLEND_FACTOR_ZERO:
    local_c = BLENDFUNC_ZERO;
    break;
  case VK_BLEND_FACTOR_ONE:
    local_c = BLENDFUNC_ONE;
    break;
  case VK_BLEND_FACTOR_SRC_COLOR:
    local_c = BLENDFUNC_SRC_COLOR;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_SRC_COLOR:
    local_c = BLENDFUNC_ONE_MINUS_SRC_COLOR;
    break;
  case VK_BLEND_FACTOR_DST_COLOR:
    local_c = BLENDFUNC_DST_COLOR;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_DST_COLOR:
    local_c = BLENDFUNC_ONE_MINUS_DST_COLOR;
    break;
  case VK_BLEND_FACTOR_SRC_ALPHA:
    local_c = BLENDFUNC_SRC_ALPHA;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA:
    local_c = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
    break;
  case VK_BLEND_FACTOR_DST_ALPHA:
    local_c = BLENDFUNC_DST_ALPHA;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_DST_ALPHA:
    local_c = BLENDFUNC_ONE_MINUS_DST_ALPHA;
    break;
  case VK_BLEND_FACTOR_CONSTANT_COLOR:
    local_c = BLENDFUNC_CONSTANT_COLOR;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_CONSTANT_COLOR:
    local_c = BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
    break;
  case VK_BLEND_FACTOR_CONSTANT_ALPHA:
    local_c = BLENDFUNC_CONSTANT_ALPHA;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_CONSTANT_ALPHA:
    local_c = BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
    break;
  case VK_BLEND_FACTOR_SRC_ALPHA_SATURATE:
    local_c = BLENDFUNC_SRC_ALPHA_SATURATE;
    break;
  case VK_BLEND_FACTOR_SRC1_COLOR:
    local_c = BLENDFUNC_SRC1_COLOR;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_SRC1_COLOR:
    local_c = BLENDFUNC_ONE_MINUS_SRC1_COLOR;
    break;
  case VK_BLEND_FACTOR_SRC1_ALPHA:
    local_c = BLENDFUNC_SRC1_ALPHA;
    break;
  case VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA:
    local_c = BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
    break;
  default:
    local_c = BLENDFUNC_LAST;
  }
  return local_c;
}

Assistant:

rr::BlendFunc mapVkBlendFactor (VkBlendFactor blend)
{
	switch (blend)
	{
		case VK_BLEND_FACTOR_ZERO:						return rr::BLENDFUNC_ZERO;
		case VK_BLEND_FACTOR_ONE:						return rr::BLENDFUNC_ONE;
		case VK_BLEND_FACTOR_SRC_COLOR:					return rr::BLENDFUNC_SRC_COLOR;
		case VK_BLEND_FACTOR_ONE_MINUS_SRC_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC_COLOR;
		case VK_BLEND_FACTOR_DST_COLOR:					return rr::BLENDFUNC_DST_COLOR;
		case VK_BLEND_FACTOR_ONE_MINUS_DST_COLOR:		return rr::BLENDFUNC_ONE_MINUS_DST_COLOR;
		case VK_BLEND_FACTOR_SRC_ALPHA:					return rr::BLENDFUNC_SRC_ALPHA;
		case VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC_ALPHA;
		case VK_BLEND_FACTOR_DST_ALPHA:					return rr::BLENDFUNC_DST_ALPHA;
		case VK_BLEND_FACTOR_ONE_MINUS_DST_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_DST_ALPHA;
		case VK_BLEND_FACTOR_CONSTANT_COLOR:			return rr::BLENDFUNC_CONSTANT_COLOR;
		case VK_BLEND_FACTOR_ONE_MINUS_CONSTANT_COLOR:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
		case VK_BLEND_FACTOR_CONSTANT_ALPHA:			return rr::BLENDFUNC_CONSTANT_ALPHA;
		case VK_BLEND_FACTOR_ONE_MINUS_CONSTANT_ALPHA:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
		case VK_BLEND_FACTOR_SRC_ALPHA_SATURATE:		return rr::BLENDFUNC_SRC_ALPHA_SATURATE;
		case VK_BLEND_FACTOR_SRC1_COLOR:				return rr::BLENDFUNC_SRC1_COLOR;
		case VK_BLEND_FACTOR_ONE_MINUS_SRC1_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC1_COLOR;
		case VK_BLEND_FACTOR_SRC1_ALPHA:				return rr::BLENDFUNC_SRC1_ALPHA;
		case VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
		default:
			DE_ASSERT(false);
	}
	return rr::BLENDFUNC_LAST;
}